

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSpaceVelocityData *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  bool bVar1;
  invalid_argument *piVar2;
  XrGeneratedDispatchTable *pXVar3;
  XrSpaceVelocityData *in_stack_fffffffffffffee8;
  allocator local_109;
  string linearvelocity_prefix;
  string velocityflags_prefix;
  string angularvelocity_prefix;
  undefined1 local_a8 [32];
  string local_88;
  undefined1 local_68 [32];
  string local_48;
  
  PointerToHexString<XrSpaceVelocityData>(in_stack_fffffffffffffee8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&velocityflags_prefix);
  std::__cxx11::string::~string((string *)&velocityflags_prefix);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&velocityflags_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&velocityflags_prefix);
  std::__cxx11::to_string(&linearvelocity_prefix,value->velocityFlags);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[21],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [21])"XrSpaceVelocityFlags",&velocityflags_prefix,
             &linearvelocity_prefix);
  std::__cxx11::string::~string((string *)&linearvelocity_prefix);
  std::__cxx11::string::string((string *)&linearvelocity_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&linearvelocity_prefix);
  std::__cxx11::string::string((string *)(local_68 + 0x20),(string *)&linearvelocity_prefix);
  pXVar3 = (XrGeneratedDispatchTable *)local_68;
  std::__cxx11::string::string((string *)pXVar3,"XrVector3f",(allocator *)&angularvelocity_prefix);
  bVar1 = ApiDumpOutputXrStruct
                    (pXVar3,&value->linearVelocity,(string *)(local_68 + 0x20),(string *)local_68,
                     false,contents);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Invalid Operation");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&angularvelocity_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&angularvelocity_prefix);
  std::__cxx11::string::string((string *)(local_a8 + 0x20),(string *)&angularvelocity_prefix);
  pXVar3 = (XrGeneratedDispatchTable *)local_a8;
  std::__cxx11::string::string((string *)pXVar3,"XrVector3f",&local_109);
  bVar1 = ApiDumpOutputXrStruct
                    (pXVar3,&value->angularVelocity,(string *)(local_a8 + 0x20),(string *)local_a8,
                     false,contents);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  if (bVar1) {
    std::__cxx11::string::~string((string *)&angularvelocity_prefix);
    std::__cxx11::string::~string((string *)&linearvelocity_prefix);
    std::__cxx11::string::~string((string *)&velocityflags_prefix);
    return true;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Invalid Operation");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpaceVelocityData* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string velocityflags_prefix = prefix;
        velocityflags_prefix += "velocityFlags";
        contents.emplace_back("XrSpaceVelocityFlags", velocityflags_prefix, std::to_string(value->velocityFlags));
        std::string linearvelocity_prefix = prefix;
        linearvelocity_prefix += "linearVelocity";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->linearVelocity, linearvelocity_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string angularvelocity_prefix = prefix;
        angularvelocity_prefix += "angularVelocity";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->angularVelocity, angularvelocity_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}